

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::DistanceFinder::find
          (SelectionSet *__return_storage_ptr__,DistanceFinder *this,SelectionSet *bs,
          RealType distance)

{
  double *pdVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  double dVar4;
  pointer pOVar5;
  Snapshot *this_00;
  RigidBody *this_01;
  StuntDouble *pSVar6;
  Atom *pAVar7;
  bool bVar8;
  double dVar9;
  uint i;
  pointer ppMVar10;
  long lVar11;
  pointer ppSVar12;
  pointer ppBVar13;
  pointer ppBVar14;
  pointer ppTVar15;
  pointer ppIVar16;
  uint i_8;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  Vector<double,_3U> result;
  Vector3d centerPos;
  SelectionSet local_e8;
  Vector3d local_c8;
  Vector3d local_a8;
  RealType local_90;
  SelectionSet local_88;
  double local_68 [3];
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  this_00 = this->info_->sman_->currentSnapshot_;
  local_90 = distance;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,&local_48);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ppSVar12 = (this->stuntdoubles_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->stuntdoubles_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar12) {
    uVar20 = 0;
    uVar19 = 1;
    do {
      this_01 = (RigidBody *)ppSVar12[uVar20];
      if ((this_01 != (RigidBody *)0x0) && ((this_01->super_StuntDouble).objType_ == otRigidBody)) {
        RigidBody::updateAtoms(this_01);
      }
      ppSVar12 = (this->stuntdoubles_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar8 = uVar19 < (ulong)((long)(this->stuntdoubles_).
                                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar12 >>
                              3);
      uVar20 = uVar19;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar8);
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&local_88.bitsets_,&bs->bitsets_);
  SelectionSet::parallelReduce(&local_e8,&local_88);
  local_c8.super_Vector<double,_3U>.data_[2] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.super_Vector<double,_3U>.data_[1] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super_Vector<double,_3U>.data_[0] =
       (double)local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e8.bitsets_.
       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_c8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_e8.bitsets_);
  lVar11 = (long)((local_88.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start)->bitset_).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p;
  if (((long)((local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_p - lVar11) * 8 +
      (ulong)((local_88.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset != 0) {
    uVar20 = 0;
    do {
      uVar17 = (ulong)(int)uVar20;
      uVar19 = uVar17 + 0x3f;
      if (-1 < (long)uVar17) {
        uVar19 = uVar17;
      }
      local_50 = uVar20;
      if ((*(ulong *)(lVar11 + ((long)uVar19 >> 6) * 8 + -8 +
                     (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar20 & 0x3f) & 1) != 0) {
        pSVar6 = (this->stuntdoubles_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar20];
        lVar11 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          + pSVar6->storage_);
        local_68[2] = (double)*(undefined8 *)(lVar11 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar11 + (long)pSVar6->localIndex_ * 0x18);
        local_68[0] = *pdVar1;
        local_68[1] = pdVar1[1];
        ppMVar10 = (this->molecules_).
                   super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->molecules_).
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppMVar10) {
          uVar20 = 0;
          do {
            if (ppMVar10[uVar20] != (Molecule *)0x0) {
              Molecule::getCom(&local_a8,ppMVar10[uVar20]);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_68[lVar11] - local_a8.super_Vector<double,_3U>.data_[lVar11]);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this_00,&local_c8);
              dVar9 = 0.0;
              lVar11 = 0;
              do {
                dVar4 = local_c8.super_Vector<double,_3U>.data_[lVar11];
                dVar9 = dVar9 + dVar4 * dVar4;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              if (dVar9 <= local_90) {
                uVar19 = uVar20 + 0x3f;
                if (-1 < (long)uVar20) {
                  uVar19 = uVar20;
                }
                puVar3 = (ulong *)(((long)uVar19 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar20 & 0x3f);
              }
            }
            uVar20 = uVar20 + 1;
            ppMVar10 = (this->molecules_).
                       super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->molecules_).
                                          super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppMVar10 >> 3));
        }
        ppSVar12 = (this->stuntdoubles_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((this->stuntdoubles_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppSVar12) {
          uVar20 = 0;
          do {
            if (ppSVar12[uVar20] != (StuntDouble *)0x0) {
              pSVar6 = ppSVar12[uVar20];
              lVar11 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_
                                );
              local_a8.super_Vector<double,_3U>.data_[2] =
                   (double)*(pointer *)(lVar11 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
              puVar2 = (undefined8 *)(lVar11 + (long)pSVar6->localIndex_ * 0x18);
              local_a8.super_Vector<double,_3U>.data_[0] = (double)*puVar2;
              local_a8.super_Vector<double,_3U>.data_[1] = (double)puVar2[1];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_68[lVar11] - local_a8.super_Vector<double,_3U>.data_[lVar11]);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              Snapshot::wrapVector(this_00,&local_c8);
              dVar9 = 0.0;
              lVar11 = 0;
              do {
                dVar4 = local_c8.super_Vector<double,_3U>.data_[lVar11];
                dVar9 = dVar9 + dVar4 * dVar4;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              if (dVar9 <= local_90) {
                uVar19 = uVar20 + 0x3f;
                if (-1 < (long)uVar20) {
                  uVar19 = uVar20;
                }
                puVar3 = (ulong *)(((long)uVar19 >> 6) * 8 +
                                   *(long *)&(((__return_storage_ptr__->bitsets_).
                                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar20 & 0x3f);
              }
            }
            uVar20 = uVar20 + 1;
            ppSVar12 = (this->stuntdoubles_).
                       super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->stuntdoubles_).
                                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppSVar12 >> 3));
        }
        ppBVar13 = (this->bonds_).
                   super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppBVar13) {
          uVar20 = 0;
          do {
            if (ppBVar13[uVar20] != (Bond *)0x0) {
              pAVar7 = *(ppBVar13[uVar20]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar18 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar18 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar7 = (ppBVar13[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] * 0.5);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar9 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar9 = dVar9 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              if (dVar9 <= local_90) {
                uVar19 = uVar20 + 0x3f;
                if (-1 < (long)uVar20) {
                  uVar19 = uVar20;
                }
                puVar3 = (ulong *)(((long)uVar19 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar20 & 0x3f);
              }
            }
            uVar20 = uVar20 + 1;
            ppBVar13 = (this->bonds_).
                       super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->bonds_).
                                          super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar13 >> 3));
        }
        ppBVar14 = (this->bends_).
                   super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppBVar14) {
          uVar20 = 0;
          do {
            if (ppBVar14[uVar20] != (Bend *)0x0) {
              pAVar7 = *(ppBVar14[uVar20]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar18 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar18 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar7 = (ppBVar14[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar7 = (ppBVar14[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] / 3.0);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar9 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar9 = dVar9 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              if (dVar9 <= local_90) {
                uVar19 = uVar20 + 0x3f;
                if (-1 < (long)uVar20) {
                  uVar19 = uVar20;
                }
                puVar3 = (ulong *)(((long)uVar19 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar20 & 0x3f);
              }
            }
            uVar20 = uVar20 + 1;
            ppBVar14 = (this->bends_).
                       super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->bends_).
                                          super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar14 >> 3));
        }
        ppTVar15 = (this->torsions_).
                   super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        if ((this->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppTVar15) {
          uVar20 = 0;
          do {
            if (ppTVar15[uVar20] != (Torsion *)0x0) {
              pAVar7 = *(ppTVar15[uVar20]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar18 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar18 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar7 = (ppTVar15[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar7 = (ppTVar15[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar7 = (ppTVar15[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[3];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] * 0.25);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar9 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar9 = dVar9 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              if (dVar9 <= local_90) {
                uVar19 = uVar20 + 0x3f;
                if (-1 < (long)uVar20) {
                  uVar19 = uVar20;
                }
                puVar3 = (ulong *)(((long)uVar19 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar20 & 0x3f);
              }
            }
            uVar20 = uVar20 + 1;
            ppTVar15 = (this->torsions_).
                       super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->torsions_).
                                          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppTVar15 >> 3));
        }
        ppIVar16 = (this->inversions_).
                   super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppIVar16) {
          uVar20 = 0;
          do {
            if (ppIVar16[uVar20] != (Inversion *)0x0) {
              pAVar7 = *(ppIVar16[uVar20]->super_ShortRangeInteraction).atoms_.
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar11 + 0x10 + lVar18 * 0x18);
              pdVar1 = (double *)(lVar11 + lVar18 * 0x18);
              local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              pAVar7 = (ppIVar16[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar7 = (ppIVar16[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              pAVar7 = (ppIVar16[uVar20]->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[3];
              lVar18 = (long)(pAVar7->super_StuntDouble).localIndex_;
              lVar11 = *(long *)((long)&(((pAVar7->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                + (pAVar7->super_StuntDouble).storage_);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   *(pointer *)(lVar11 + 0x10 + lVar18 * 0x18);
              puVar2 = (undefined8 *)(lVar11 + lVar18 * 0x18);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar2;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar2[1];
              lVar11 = 0;
              do {
                local_c8.super_Vector<double,_3U>.data_[lVar11] =
                     (double)(&local_e8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)[lVar11] +
                     local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar11 = 0;
              do {
                (&local_e8.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar11] =
                     (pointer)(local_c8.super_Vector<double,_3U>.data_[lVar11] * 0.25);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_c8.super_Vector<double,_3U>.data_[2] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_c8.super_Vector<double,_3U>.data_[0] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_c8.super_Vector<double,_3U>.data_[1] =
                   (double)local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_a8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_a8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar11 = 0;
              do {
                local_a8.super_Vector<double,_3U>.data_[lVar11] =
                     local_68[lVar11] - local_c8.super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[2];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[0];
              local_e8.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_a8.super_Vector<double,_3U>.data_[1];
              Snapshot::wrapVector(this_00,(Vector3d *)&local_e8);
              dVar9 = 0.0;
              lVar11 = 0;
              do {
                pOVar5 = (&local_e8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar11];
                dVar9 = dVar9 + (double)pOVar5 * (double)pOVar5;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              if (dVar9 <= local_90) {
                uVar19 = uVar20 + 0x3f;
                if (-1 < (long)uVar20) {
                  uVar19 = uVar20;
                }
                puVar3 = (ulong *)(((long)uVar19 >> 6) * 8 +
                                   *(long *)&(__return_storage_ptr__->bitsets_).
                                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                             ._M_impl.super__Vector_impl_data._M_start[4].bitset_.
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar3 = *puVar3 | 1L << ((byte)uVar20 & 0x3f);
              }
            }
            uVar20 = uVar20 + 1;
            ppIVar16 = (this->inversions_).
                       super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar20 < (ulong)((long)(this->inversions_).
                                          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppIVar16 >> 3));
        }
      }
      uVar20 = local_50 + 1;
      lVar11 = (long)((local_88.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p;
    } while (uVar20 < (ulong)((local_88.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)((local_88.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      lVar11) * 8);
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_88.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms();
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
#ifdef IS_MPI

        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos();
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos();
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos();
            loc += bonds_[j]->getAtomB()->getPos();
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos();
            loc += bends_[j]->getAtomB()->getPos();
            loc += bends_[j]->getAtomC()->getPos();
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos();
            loc += torsions_[j]->getAtomB()->getPos();
            loc += torsions_[j]->getAtomC()->getPos();
            loc += torsions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos();
            loc += inversions_[j]->getAtomB()->getPos();
            loc += inversions_[j]->getAtomC()->getPos();
            loc += inversions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }